

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phoenix_evsa.cpp
# Opt level: O1

void __thiscall phoenix_evsa_t::evsa_data_t::_read(evsa_data_t *this)

{
  phoenix_evsa_t *ppVar1;
  evsa_variable_attributes_t *peVar2;
  uint16_t uVar3;
  uint32_t uVar4;
  evsa_variable_attributes_t *this_00;
  string local_30;
  
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_guid_id = uVar3;
  uVar3 = kaitai::kstream::read_u2le((this->super_kstruct).m__io);
  this->m_var_id = uVar3;
  this_00 = (evsa_variable_attributes_t *)operator_new(0x40);
  ppVar1 = this->m__root;
  (this_00->super_kstruct).m__io = (this->super_kstruct).m__io;
  (this_00->super_kstruct)._vptr_kstruct = (_func_int **)&PTR__evsa_variable_attributes_t_001aa1d0;
  this_00->m__parent = this;
  this_00->m__root = ppVar1;
  evsa_variable_attributes_t::_read(this_00);
  peVar2 = (this->m_attributes)._M_t.
           super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
           ._M_t.
           super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
           .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl;
  (this->m_attributes)._M_t.
  super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  ._M_t.
  super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
  .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl = this_00
  ;
  if (peVar2 != (evsa_variable_attributes_t *)0x0) {
    (**(code **)((long)(peVar2->super_kstruct)._vptr_kstruct + 8))();
  }
  this->n_len_data_ext = true;
  if (((this->m_attributes)._M_t.
       super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl)->
      m_extended_header == true) {
    this->n_len_data_ext = false;
    uVar4 = kaitai::kstream::read_u4le((this->super_kstruct).m__io);
    this->m_len_data_ext = uVar4;
  }
  this->n_data = true;
  if (((this->m_attributes)._M_t.
       super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl)->
      m_extended_header == false) {
    this->n_data = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_30,(this->super_kstruct).m__io,(ulong)this->m__parent->m_len_evsa_entry - 0xc)
    ;
    std::__cxx11::string::operator=((string *)&this->m_data,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  this->n_data_ext = true;
  if (((this->m_attributes)._M_t.
       super___uniq_ptr_impl<phoenix_evsa_t::evsa_variable_attributes_t,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_std::default_delete<phoenix_evsa_t::evsa_variable_attributes_t>_>
       .super__Head_base<0UL,_phoenix_evsa_t::evsa_variable_attributes_t_*,_false>._M_head_impl)->
      m_extended_header == true) {
    this->n_data_ext = false;
    kaitai::kstream::read_bytes_abi_cxx11_
              (&local_30,(this->super_kstruct).m__io,(ulong)this->m_len_data_ext);
    std::__cxx11::string::operator=((string *)&this->m_data_ext,(string *)&local_30);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void phoenix_evsa_t::evsa_data_t::_read() {
    m_guid_id = m__io->read_u2le();
    m_var_id = m__io->read_u2le();
    m_attributes = std::unique_ptr<evsa_variable_attributes_t>(new evsa_variable_attributes_t(m__io, this, m__root));
    n_len_data_ext = true;
    if (attributes()->extended_header()) {
        n_len_data_ext = false;
        m_len_data_ext = m__io->read_u4le();
    }
    n_data = true;
    if (!(attributes()->extended_header())) {
        n_data = false;
        m_data = m__io->read_bytes((_parent()->len_evsa_entry() - 12));
    }
    n_data_ext = true;
    if (attributes()->extended_header()) {
        n_data_ext = false;
        m_data_ext = m__io->read_bytes(len_data_ext());
    }
}